

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::tokenize_on_placeholders
          (Tokenizer *this,string *text,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens)

{
  CharInfo *pCVar1;
  Token *pTVar2;
  const_reference pvVar3;
  TokensBuilder *pTVar4;
  long in_RDI;
  code_point_t v;
  value_type *c;
  Token *token;
  size_t i;
  bool in_features;
  bool in_placeholder;
  TokensBuilder builder;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  CharInfo *in_stack_fffffffffffffed8;
  TokensBuilder *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  TokensBuilder *in_stack_fffffffffffffef0;
  CharInfo *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  string *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff20;
  code_point_t cVar5;
  CharInfo *pCVar6;
  CharInfo *character;
  undefined2 in_stack_ffffffffffffff40;
  byte bVar7;
  byte bVar8;
  undefined4 in_stack_ffffffffffffff44;
  TokensBuilder local_b0;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> local_30 [2];
  
  unicode::get_characters_info(in_stack_ffffffffffffff08);
  TokensBuilder::TokensBuilder
            (in_stack_fffffffffffffef0,
             (Options *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
             (vector<onmt::Token,_std::allocator<onmt::Token>_> *)in_stack_fffffffffffffee0);
  bVar8 = 0;
  bVar7 = 0;
  pCVar6 = (CharInfo *)0x0;
  while (character = pCVar6,
        pCVar1 = (CharInfo *)
                 std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                 size(local_30), pCVar6 < pCVar1) {
    pTVar2 = TokensBuilder::current(&local_b0);
    pvVar3 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
             operator[](local_30,(size_type)character);
    cVar5 = pvVar3->value;
    if ((bVar8 & 1) == 0) {
      if (((*(byte *)(in_RDI + 0x5c) & 1) == 0) ||
         (in_stack_ffffffffffffff07 =
               unicode::CharInfo::operator==
                         ((CharInfo *)in_stack_fffffffffffffef0,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffeef,
                                   CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))),
         !(bool)in_stack_ffffffffffffff07)) {
        if (cVar5 == 0xff5f) {
          in_stack_fffffffffffffeef = Token::empty((Token *)0x3c4b81);
          if (!(bool)in_stack_fffffffffffffeef) {
            if ((character != (CharInfo *)0x0) &&
               (pvVar3 = std::
                         vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                         operator[](local_30,(size_type)&character[-1].field_0x1f),
               pvVar3->char_type != Separator)) {
              pTVar2->join_right = true;
            }
            if ((*(byte *)(in_RDI + 0x5b) & 1) != 0) {
              pTVar2->preserve = true;
            }
            TokensBuilder::segment((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20));
          }
          TokensBuilder::append(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          bVar8 = 1;
        }
        else if (*(int *)(in_RDI + 8) == 3) {
          in_stack_fffffffffffffeee =
               unicode::CharInfo::operator==
                         ((CharInfo *)in_stack_fffffffffffffef0,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffeef,
                                   CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
          if ((bool)in_stack_fffffffffffffeee) {
            TokensBuilder::flush_feature((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20))
            ;
            bVar7 = 1;
          }
          else if (pvVar3->char_type == Separator) {
            TokensBuilder::flush_feature((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20))
            ;
            TokensBuilder::segment((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20));
            bVar7 = 0;
          }
          else if ((bVar7 & 1) == 0) {
            TokensBuilder::safe_append
                      ((TokensBuilder *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                       in_stack_fffffffffffffef8);
          }
          else {
            TokensBuilder::append_to_feature(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          }
        }
        else {
          TokensBuilder::safe_append
                    ((TokensBuilder *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                     in_stack_fffffffffffffef8);
        }
      }
      else {
        in_stack_ffffffffffffff06 = Token::empty((Token *)0x3c4aa1);
        if ((bool)in_stack_ffffffffffffff06) {
          if ((character == (CharInfo *)0x0) ||
             (pvVar3 = std::
                       vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                       operator[](local_30,(size_type)&character[-1].field_0x1f),
             pvVar3->char_type != Separator)) {
            in_stack_fffffffffffffef8 =
                 (CharInfo *)TokensBuilder::num_tokens((TokensBuilder *)0x3c4b1d);
            if (in_stack_fffffffffffffef8 != (CharInfo *)0x0) {
              in_stack_fffffffffffffef0 =
                   (TokensBuilder *)TokensBuilder::previous((TokensBuilder *)0x3c4b39);
              *(undefined1 *)((long)&in_stack_fffffffffffffef0->_current_token + 0x19) = 1;
            }
          }
          else {
            pTVar2->join_left = true;
          }
        }
        else {
          pTVar2->join_right = true;
          TokensBuilder::segment((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20));
        }
      }
    }
    else if (pvVar3->char_type == Separator) {
      TokensBuilder::escape_append
                ((TokensBuilder *)
                 CONCAT44(in_stack_ffffffffffffff44,
                          CONCAT13(bVar8,CONCAT12(bVar7,in_stack_ffffffffffffff40))),character);
    }
    else {
      TokensBuilder::append(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (cVar5 == 0xff60) {
        in_stack_fffffffffffffee0 = (TokensBuilder *)((long)&character->data + 1);
        pTVar4 = (TokensBuilder *)
                 std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                 size(local_30);
        if ((in_stack_fffffffffffffee0 < pTVar4) &&
           (pvVar3 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ::operator[](local_30,(size_type)((long)&character->data + 1)),
           pvVar3->char_type != Separator)) {
          pTVar2->join_right = true;
        }
        if (((*(byte *)(in_RDI + 0x5a) & 1) != 0) || ((*(byte *)(in_RDI + 0x5b) & 1) != 0)) {
          pTVar2->preserve = true;
        }
        TokensBuilder::segment((TokensBuilder *)CONCAT44(cVar5,in_stack_ffffffffffffff20));
        bVar8 = 0;
      }
    }
    pCVar6 = (CharInfo *)((long)&character->data + 1);
  }
  TokensBuilder::~TokensBuilder(in_stack_fffffffffffffee0);
  std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::~vector
            ((vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *)
             in_stack_fffffffffffffef0);
  return;
}

Assistant:

void Tokenizer::tokenize_on_placeholders(const std::string& text,
                                           std::vector<Token>& tokens) const
  {
    // Split on characters.
    const auto chars = unicode::get_characters_info(text);

    TokensBuilder builder(_options, tokens);
    bool in_placeholder = false;
    bool in_features = false;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      auto& token = builder.current();
      const auto& c = chars[i];
      const auto v = c.value;

      if (!in_placeholder)
      {
        if (_options.support_prior_joiners && c == _options.joiner)
        {
          // Mark joint but discard character.
          if (token.empty())
          {
            if (i > 0 && chars[i - 1].char_type == unicode::CharType::Separator)
              token.join_left = true;
            else if (builder.num_tokens() > 0)
              builder.previous().join_right = true;
          }
          else
          {
            token.join_right = true;
            builder.segment();
          }
        }
        else if (v == ph_marker_open_cp)
        {
          if (!token.empty())
          {
            // Flush accumulated token and mark joint if it did not finish by a separator.
            if (i > 0 && chars[i - 1].char_type != unicode::CharType::Separator)
              token.join_right = true;
            if (_options.preserve_segmented_tokens)
              token.preserve = true;
            builder.segment();
          }

          builder.append(c);
          in_placeholder = true;
        }
        else if (_options.mode == Mode::Space)
        {
          if (c == ITokenizer::feature_marker)
          {
            builder.flush_feature();
            in_features = true;
          }
          else if (c.char_type == unicode::CharType::Separator)
          {
            builder.flush_feature();
            builder.segment();
            in_features = false;
          }
          else if (in_features)
          {
            builder.append_to_feature(c);
          }
          else
          {
            builder.safe_append(c);
          }
        }
        else
        {
          // Normalize character for consistency with other tokenization modes.
          builder.safe_append(c);
        }
      }

      // In a placeholder.
      else if (c.char_type == unicode::CharType::Separator)
        builder.escape_append(c);
      else
      {
        builder.append(c);  // Do not normalize character inside placeholders.
        if (v == ph_marker_close_cp)
        {
          // Flush accumulated placeholder and mark joint if the next character is not a separator.
          // No need to check for emptiness as in_placeholder == true means at least the opening
          // character was accumulated.
          if (i + 1 < chars.size() && chars[i + 1].char_type != unicode::CharType::Separator)
            token.join_right = true;
          if (_options.preserve_placeholders || _options.preserve_segmented_tokens)
            token.preserve = true;
          builder.segment();
          in_placeholder = false;
        }
      }
    }
  }